

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBoxPrivate::editorTextChanged(QAbstractSpinBoxPrivate *this,QString *t)

{
  long *plVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  int pos;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)&this->field_0x3d0 & 0x40) == 0) {
    *(ushort *)&this->field_0x3d0 = *(ushort *)&this->field_0x3d0 | 1;
  }
  else {
    plVar1 = *(long **)&(this->super_QWidgetPrivate).field_0x8;
    local_68 = &((t->d).d)->super_QArrayData;
    pcStack_60 = (t->d).ptr;
    local_58 = (t->d).size;
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QLineEdit::cursorPosition(this->edit);
    iVar4 = (**(code **)(*plVar1 + 0x1a0))(plVar1,&local_68);
    if (iVar4 == 2) {
      local_48._16_4_ = 0xaaaaaaaa;
      local_48._20_4_ = 0xaaaaaaaa;
      uStack_30 = 0xaaaaaaaa;
      uStack_2c = 0xaaaaaaaa;
      local_48._0_4_ = 0xaaaaaaaa;
      local_48._4_4_ = 0xaaaaaaaa;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)&this->super_QWidgetPrivate + 0xe0))(&local_48,this,&local_68);
      lVar2 = (t->d).size;
      bVar3 = true;
      if (local_58 == lVar2) {
        QVar5.m_data = pcStack_60;
        QVar5.m_size = local_58;
        QVar6.m_data = (t->d).ptr;
        QVar6.m_size = lVar2;
        bVar3 = QtPrivate::equalStrings(QVar5,QVar6);
        bVar3 = bVar3 ^ 1;
      }
      setValue(this,(QVariant *)&local_48,EmitIfChanged,(bool)bVar3);
      this->field_0x3d0 = this->field_0x3d0 & 0xfe;
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
    else {
      this->field_0x3d0 = this->field_0x3d0 | 1;
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::editorTextChanged(const QString &t)
{
    Q_Q(QAbstractSpinBox);

    if (keyboardTracking) {
        QString tmp = t;
        int pos = edit->cursorPosition();
        QValidator::State state = q->validate(tmp, pos);
        if (state == QValidator::Acceptable) {
            const QVariant v = valueFromText(tmp);
            setValue(v, EmitIfChanged, tmp != t);
            pendingEmit = false;
        } else {
            pendingEmit = true;
        }
    } else {
        pendingEmit = true;
    }
}